

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O0

void k054539_alloc_rom(void *chip,UINT32 memsize)

{
  UINT32 UVar1;
  void *pvVar2;
  k054539_state *info;
  UINT32 memsize_local;
  void *chip_local;
  
  if (*(UINT32 *)((long)chip + 0xb38) != memsize) {
    pvVar2 = realloc(*(void **)((long)chip + 0xb30),(ulong)memsize);
    *(void **)((long)chip + 0xb30) = pvVar2;
    *(UINT32 *)((long)chip + 0xb38) = memsize;
    memset(*(void **)((long)chip + 0xb30),0xff,(ulong)memsize);
    UVar1 = pow2_mask(memsize);
    *(UINT32 *)((long)chip + 0xb3c) = UVar1;
  }
  return;
}

Assistant:

static void k054539_alloc_rom(void* chip, UINT32 memsize)
{
	k054539_state *info = (k054539_state *)chip;
	
	if (info->rom_size == memsize)
		return;
	
	info->rom = (UINT8*)realloc(info->rom, memsize);
	info->rom_size = memsize;
	memset(info->rom, 0xFF, memsize);
	
	info->rom_mask = pow2_mask(memsize);
	
	return;
}